

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer,UseMemoization useMemoization)

{
  int iVar1;
  long lVar2;
  Printer *this_00;
  UseMemoization UVar3;
  bool bVar4;
  JavaType JVar5;
  Descriptor *pDVar6;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar7;
  Descriptor *descriptor;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  char *pcVar8;
  long lVar9;
  char *__end;
  long lVar10;
  char *pcVar11;
  string local_d0;
  allocator_type local_ac;
  equal_to<const_google::protobuf::Descriptor_*> local_ab;
  hash<const_google::protobuf::Descriptor_*> local_aa;
  _Identity<const_google::protobuf::Descriptor_*> local_a9;
  Printer *local_a8;
  UseMemoization local_9c;
  undefined1 local_98 [48];
  string local_68;
  char *__end_1;
  char *local_40;
  MessageGenerator *local_38;
  
  local_38 = this;
  if (useMemoization == MEMOIZE) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
    io::Printer::Print(printer,"public final boolean isInitialized() {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized != -1) return isInitialized == 1;\n\n"
                      );
    pFVar7 = extraout_RDX_00;
  }
  else {
    io::Printer::Print(printer,"public final boolean isInitialized() {\n");
    io::Printer::Indent(printer);
    pFVar7 = extraout_RDX;
  }
  pDVar6 = local_38->descriptor_;
  pcVar11 = "";
  local_a8 = printer;
  local_9c = useMemoization;
  if (0 < *(int *)(pDVar6 + 0x2c)) {
    if (useMemoization == MEMOIZE) {
      pcVar11 = "memoizedIsInitialized = 0;";
    }
    pcVar8 = pcVar11 + 0x1a;
    if (useMemoization != MEMOIZE) {
      pcVar8 = pcVar11;
    }
    lVar9 = 0;
    lVar10 = 0;
    do {
      if (*(int *)(*(long *)(pDVar6 + 0x30) + 0x30 + lVar9) == 2) {
        UnderscoresToCapitalizedCamelCase_abi_cxx11_
                  ((string *)local_98,(java *)(*(long *)(pDVar6 + 0x30) + lVar9),pFVar7);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar11,pcVar8);
        io::Printer::Print(local_a8,"if (!has$name$()) {\n  $memoize$\n  return false;\n}\n","name",
                           (string *)local_98,"memoize",&local_d0);
        pFVar7 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          pFVar7 = extraout_RDX_02;
        }
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          pFVar7 = extraout_RDX_03;
        }
        pDVar6 = local_38->descriptor_;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x78;
    } while (lVar10 < *(int *)(pDVar6 + 0x2c));
    if (0 < *(int *)(pDVar6 + 0x2c)) {
      local_40 = "";
      if (local_9c == MEMOIZE) {
        local_40 = "memoizedIsInitialized = 0;";
      }
      __end_1 = local_40 + 0x1a;
      if (local_9c != MEMOIZE) {
        __end_1 = local_40;
      }
      lVar10 = 0;
      lVar9 = 0;
      do {
        lVar2 = *(long *)(pDVar6 + 0x30);
        pFVar7 = (FieldDescriptor *)(lVar10 + lVar2);
        JVar5 = GetJavaType(pFVar7);
        if (JVar5 == JAVATYPE_MESSAGE) {
          pDVar6 = *(Descriptor **)(lVar2 + 0x48 + lVar10);
          std::tr1::
          _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
          ::_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                        *)local_98,10,&local_aa,(_Mod_range_hashing *)&local_d0,
                       (_Default_ranged_hash *)&local_68,&local_ab,&local_a9,&local_ac);
          bVar4 = anon_unknown_5::HasRequiredFields
                            (pDVar6,(hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                                     *)local_98);
          std::tr1::
          _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
          ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                         *)local_98);
          if (bVar4) {
            iVar1 = *(int *)(lVar2 + 0x30 + lVar10);
            if (iVar1 == 1) {
              ClassName_abi_cxx11_((string *)local_98,*(java **)(lVar2 + 0x48 + lVar10),descriptor);
              UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d0,(java *)pFVar7,field_01);
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_40,__end_1);
              io::Printer::Print(local_a8,
                                 "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                                 ,"type",(string *)local_98,"name",&local_d0,"memoize",&local_68);
            }
            else if (iVar1 == 3) {
              ClassName_abi_cxx11_((string *)local_98,*(java **)(lVar2 + 0x48 + lVar10),descriptor);
              UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d0,(java *)pFVar7,field_00);
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_40,__end_1);
              io::Printer::Print(local_a8,
                                 "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                                 ,"type",(string *)local_98,"name",&local_d0,"memoize",&local_68);
            }
            else {
              if (iVar1 != 2) goto LAB_001a5796;
              ClassName_abi_cxx11_((string *)local_98,*(java **)(lVar2 + 0x48 + lVar10),descriptor);
              UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d0,(java *)pFVar7,field);
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_40,__end_1);
              io::Printer::Print(local_a8,
                                 "if (!get$name$().isInitialized()) {\n  $memoize$\n  return false;\n}\n"
                                 ,"type",(string *)local_98,"name",&local_d0,"memoize",&local_68);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
              operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
            }
          }
        }
LAB_001a5796:
        lVar9 = lVar9 + 1;
        pDVar6 = local_38->descriptor_;
        lVar10 = lVar10 + 0x78;
      } while (lVar9 < *(int *)(pDVar6 + 0x2c));
    }
  }
  UVar3 = local_9c;
  this_00 = local_a8;
  if (0 < *(int *)(pDVar6 + 0x58)) {
    pcVar11 = "";
    if (local_9c == MEMOIZE) {
      pcVar11 = "memoizedIsInitialized = 0;";
    }
    pcVar8 = pcVar11 + 0x1a;
    if (local_9c != MEMOIZE) {
      pcVar8 = pcVar11;
    }
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar11,pcVar8);
    io::Printer::Print(this_00,
                       "if (!extensionsAreInitialized()) {\n  $memoize$\n  return false;\n}\n",
                       "memoize",(string *)local_98);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  io::Printer::Outdent(this_00);
  if (UVar3 == MEMOIZE) {
    io::Printer::Print(this_00,"  memoizedIsInitialized = 1;\n");
  }
  io::Printer::Print(this_00,"  return true;\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateIsInitialized(
    io::Printer* printer, UseMemoization useMemoization) {
  bool memoization = useMemoization == MEMOIZE;
  if (memoization) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }
  printer->Print(
    "public final boolean isInitialized() {\n");
  printer->Indent();

  if (memoization) {
    printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized != -1) return isInitialized == 1;\n"
      "\n");
  }

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  $memoize$\n"
        "  return false;\n"
        "}\n",
        "name", UnderscoresToCapitalizedCamelCase(field),
        "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
             "  $memoize$\n"
             "  return false;\n"
             "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
            "if (has$name$()) {\n"
            "  if (!get$name$().isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_REPEATED:
          printer->Print(
            "for (int i = 0; i < get$name$Count(); i++) {\n"
            "  if (!get$name$(i).isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  $memoize$\n"
      "  return false;\n"
      "}\n",
      "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
  }

  printer->Outdent();

  if (memoization) {
    printer->Print(
      "  memoizedIsInitialized = 1;\n");
  }

  printer->Print(
    "  return true;\n"
    "}\n"
    "\n");
}